

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifrdm(bifcxdef *ctx,int argc)

{
  voccxdef *ctx_00;
  long lVar1;
  long in_RDI;
  voccxdef *voc;
  runsdef val;
  objnum func;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  runsdef local_20;
  objnum local_e;
  
  ctx_00 = *(voccxdef **)(*(long *)(in_RDI + 8) + 0x70);
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) != '\n') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
            in_stack_ffffffffffffffcc);
  }
  local_e = *(objnum *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  local_20._0_8_ = *(undefined8 *)(lVar1 + -0x10);
  local_20.runsv = *(anon_union_8_4_1dda36f5_for_runsv *)(lVar1 + -8);
  vocremfd(ctx_00,ctx_00->voccxdmn,local_e,0,&local_20,0x409);
  return;
}

Assistant:

void bifrdm(bifcxdef *ctx, int argc)
{
    objnum    func;
    runsdef   val;
    voccxdef *voc = ctx->bifcxrun->runcxvoc;
    
    bifcntargs(ctx, 2, argc);
    func = runpopfn(ctx->bifcxrun);
    runpop(ctx->bifcxrun, &val);
    vocremfd(voc, voc->voccxdmn, func, (prpnum)0,
             &val, ERR_NODMN);
}